

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int nresults_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->k == VCALL) {
    fs->f->code[(e->u).s.info] =
         fs->f->code[(e->u).s.info] & 0xff803fff | (nresults + 1U & 0x1ff) << 0xe;
  }
  else if (e->k == VVARARG) {
    fs->f->code[(e->u).s.info] = fs->f->code[(e->u).s.info] & 0x7fffff | (nresults + 1) * 0x800000;
    fs->f->code[(e->u).s.info] =
         fs->f->code[(e->u).s.info] & 0xffffc03f | (fs->freereg & 0xffU) << 6;
    luaK_reserveregs(fs,1);
  }
  return;
}

Assistant:

static void luaK_setreturns(FuncState*fs,expdesc*e,int nresults){
if(e->k==VCALL){
SETARG_C(getcode(fs,e),nresults+1);
}
else if(e->k==VVARARG){
SETARG_B(getcode(fs,e),nresults+1);
SETARG_A(getcode(fs,e),fs->freereg);
luaK_reserveregs(fs,1);
}
}